

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O2

CURLcode cf_h2_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  tunnel_stream *ts;
  nghttp2_session **session_ptr;
  undefined8 *puVar1;
  bool bVar2;
  httpreq *req;
  nghttp2_session_callbacks *callbacks;
  CURLcode CVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  timediff_t tVar7;
  dynhds_entry *pdVar8;
  char *pcVar9;
  h2_tunnel_state new_state;
  long *plVar10;
  long *plVar11;
  char *pcVar12;
  long lVar13;
  nghttp2_nv *nva;
  _Bool _Var14;
  httpreq *local_b0;
  nghttp2_session_callbacks *cbs;
  code *local_a0;
  long local_98;
  long *local_90;
  _Bool *local_88;
  int port;
  undefined4 uStack_7c;
  void *local_78;
  nghttp2_session *local_70;
  char *hostname;
  size_t local_60;
  size_t sStack_58;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  plVar11 = (long *)cf->ctx;
  plVar10 = plVar11;
  if ((cf->next->field_0x24 & 1) == 0) {
    CVar3 = Curl_conn_cf_connect(cf->next,data,blocking,done);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done != true) {
      return CURLE_OK;
    }
    plVar10 = (long *)cf->ctx;
  }
  *done = false;
  lVar13 = plVar10[1];
  plVar10[1] = (long)data;
  local_90 = plVar11;
  if (*plVar11 == 0) {
    cbs = (nghttp2_session_callbacks *)0x0;
    memset(plVar10 + 0x12,0,0xa8);
    Curl_bufq_init((bufq *)(plVar10 + 2),0x4000,0x280);
    Curl_bufq_init((bufq *)(plVar10 + 10),0x4000,1);
    *(undefined4 *)(plVar10 + 0x26) = 0;
    *(undefined4 *)(plVar10 + 0x24) = 0xffffffff;
    Curl_bufq_init2((bufq *)(plVar10 + 0x13),0x4000,0x280,1);
    Curl_bufq_init((bufq *)(plVar10 + 0x1b),0x4000,8);
    CVar3 = Curl_http_proxy_get_destination(cf,&hostname,&port,(_Bool *)&local_b0);
    local_98 = lVar13;
    if (CVar3 == CURLE_OK) {
      pcVar12 = "[";
      if ((char)local_b0 == '\0') {
        pcVar12 = "";
      }
      pcVar9 = "]";
      if ((char)local_b0 == '\0') {
        pcVar9 = "";
      }
      pcVar12 = curl_maprintf("%s%s%s:%d",pcVar12,CONCAT44(hostname._4_4_,hostname._0_4_),pcVar9,
                              (ulong)(uint)port);
      plVar10[0x23] = (long)pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_00582905;
      iVar4 = nghttp2_session_callbacks_new(&cbs);
      if (iVar4 == 0) {
        nghttp2_session_callbacks_set_send_callback(cbs,on_session_send);
        nghttp2_session_callbacks_set_on_frame_recv_callback(cbs,proxy_h2_on_frame_recv);
        nghttp2_session_callbacks_set_on_frame_send_callback(cbs,proxy_h2_on_frame_send);
        nghttp2_session_callbacks_set_on_data_chunk_recv_callback(cbs,tunnel_recv_callback);
        nghttp2_session_callbacks_set_on_stream_close_callback(cbs,proxy_h2_on_stream_close);
        nghttp2_session_callbacks_set_on_header_callback(cbs,proxy_h2_on_header);
        callbacks = cbs;
        session_ptr = (nghttp2_session **)cf->ctx;
        iVar4 = nghttp2_option_new((nghttp2_option **)&hostname);
        if (iVar4 != 0) {
LAB_00582a3d:
          pcVar12 = "Couldn\'t initialize nghttp2";
          goto LAB_00582a44;
        }
        nghttp2_option_set_no_auto_window_update
                  ((nghttp2_option *)CONCAT44(hostname._4_4_,hostname._0_4_),1);
        nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation
                  ((nghttp2_option *)CONCAT44(hostname._4_4_,hostname._0_4_),1);
        iVar4 = nghttp2_session_client_new2
                          (session_ptr,callbacks,cf,
                           (nghttp2_option *)CONCAT44(hostname._4_4_,hostname._0_4_));
        nghttp2_option_del((nghttp2_option *)CONCAT44(hostname._4_4_,hostname._0_4_));
        if (iVar4 != 0) goto LAB_00582a3d;
        hostname._0_4_ = 3;
        hostname._4_4_ = Curl_multi_max_concurrent_streams(data->multi);
        local_60 = 0xa0000000000004;
        sStack_58 = 2;
        uVar6 = nghttp2_submit_settings
                          ((nghttp2_session *)*plVar10,'\0',(nghttp2_settings_entry *)&hostname,3);
        CVar3 = CURLE_HTTP2;
        if (uVar6 == 0) {
          uVar6 = nghttp2_session_set_local_window_size
                            ((nghttp2_session *)*plVar10,'\0',0,0x6400000);
          if (uVar6 != 0) {
            pcVar12 = nghttp2_strerror(uVar6);
            pcVar9 = "nghttp2_session_set_local_window_size() failed: %s(%d)";
            goto LAB_00582f87;
          }
          bVar2 = true;
          CVar3 = CURLE_OK;
        }
        else {
          pcVar12 = nghttp2_strerror(uVar6);
          pcVar9 = "nghttp2_submit_settings() failed: %s(%d)";
LAB_00582f87:
          bVar2 = false;
          Curl_failf(data,pcVar9,pcVar12,(ulong)uVar6);
        }
      }
      else {
        pcVar12 = "Couldn\'t initialize nghttp2 callbacks";
LAB_00582a44:
        bVar2 = false;
        Curl_failf(data,pcVar12);
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
LAB_00582905:
      CVar3 = CURLE_OUT_OF_MEMORY;
      bVar2 = false;
    }
    if (cbs != (nghttp2_session_callbacks *)0x0) {
      nghttp2_session_callbacks_del(cbs);
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
       (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[0] init proxy ctx -> %d",(ulong)CVar3);
    }
    lVar13 = local_98;
    if (!bVar2) {
      _Var14 = false;
      goto LAB_00582ee0;
    }
  }
  tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
  if (0 < tVar7) {
    ts = (tunnel_stream *)(local_90 + 0x12);
    local_78 = cf->ctx;
    uVar5 = (undefined4)local_90[0x26];
    CVar3 = CURLE_OK;
    plVar11 = local_90;
    local_98 = lVar13;
    local_88 = done;
LAB_00582adf:
    switch(uVar5) {
    case 0:
      goto switchD_00582af8_caseD_0;
    case 1:
      goto switchD_00582af8_caseD_1;
    case 2:
      goto switchD_00582af8_caseD_2;
    case 3:
      goto switchD_00582af8_caseD_3;
    case 4:
      CVar3 = CURLE_RECV_ERROR;
      goto LAB_00582ec4;
    default:
      goto switchD_00582af8_default;
    }
  }
  _Var14 = false;
  Curl_failf(data,"Proxy CONNECT aborted due to timeout");
  CVar3 = CURLE_OPERATION_TIMEDOUT;
  local_98 = lVar13;
  goto LAB_00582ee0;
switchD_00582af8_caseD_0:
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[0] CONNECT start for %s",plVar11[0x23]);
  }
  puVar1 = (undefined8 *)cf->ctx;
  local_b0 = (httpreq *)0x0;
  CVar3 = Curl_http_proxy_create_CONNECT(&local_b0,cf,data,2);
  if (CVar3 == CURLE_OK) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Establish HTTP/2 proxy tunnel to %s",local_b0->authority);
    }
    req = local_b0;
    local_70 = (nghttp2_session *)*puVar1;
    Curl_dynhds_init((dynhds *)&hostname,0,0x100000);
    CVar3 = Curl_http_req_to_h2((dynhds *)&hostname,req,data);
    nva = (nghttp2_nv *)0x0;
    uVar6 = 0xffffffff;
    if (CVar3 == CURLE_OK) {
      nva = Curl_dynhds_to_nva((dynhds *)&hostname,(size_t *)&port);
      if (nva == (nghttp2_nv *)0x0) {
        nva = (nghttp2_nv *)0x0;
        uVar6 = 0xffffffff;
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        local_a0 = tunnel_send_callback;
        CVar3 = CURLE_OK;
        cbs = (nghttp2_session_callbacks *)cf;
        uVar6 = nghttp2_submit_request
                          (local_70,(nghttp2_priority_spec *)0x0,nva,CONCAT44(uStack_7c,port),
                           (nghttp2_data_provider *)&cbs,ts);
        if ((int)uVar6 < 0) {
          pcVar12 = nghttp2_strerror(uVar6);
          Curl_failf(data,"nghttp2_session_upgrade2() failed: %s(%d)",pcVar12,(ulong)uVar6);
          CVar3 = CURLE_SEND_ERROR;
        }
      }
    }
    (*Curl_cfree)(nva);
    Curl_dynhds_free((dynhds *)&hostname);
    plVar11 = local_90;
    *(uint *)(local_90 + 0x24) = uVar6;
    if (((CVar3 != CURLE_OK && data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0))
       && (0 < cf->cft->log_level)) {
      pcVar12 = nghttp2_strerror(uVar6);
      Curl_trc_cf_infof(data,cf,"[%d] send, nghttp2_submit_request error: %s",(ulong)uVar6,pcVar12);
    }
  }
  if (local_b0 != (httpreq *)0x0) {
    Curl_http_req_free(local_b0);
  }
  if (CVar3 != CURLE_OK) {
    Curl_failf(data,"Failed sending CONNECT to proxy");
    goto LAB_00582eae;
  }
  h2_tunnel_go_state(cf,ts,H2_TUNNEL_CONNECT,data);
switchD_00582af8_caseD_1:
  CVar3 = proxy_h2_progress_ingress(cf,data);
  if (CVar3 == CURLE_OK) {
    CVar3 = proxy_h2_progress_egress(cf,data);
  }
  if ((CVar3 == CURLE_OK) || (CVar3 == CURLE_AGAIN)) {
    if ((*(byte *)((long)plVar11 + 0x134) & 1) == 0) goto LAB_00582e7c;
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_RESPONSE,data);
switchD_00582af8_caseD_2:
    iVar4 = ts->resp->status;
    if (99 < iVar4 - 200U) {
      pcVar12 = "WWW-Authenticate";
      if (iVar4 == 0x191) {
LAB_00582d68:
        pdVar8 = Curl_dynhds_cget(&ts->resp->headers,pcVar12);
        if (pdVar8 != (dynhds_entry *)0x0) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
             (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"[0] CONNECT: fwd auth header \'%s\'",pdVar8->value);
          }
          CVar3 = Curl_http_input_auth(data,ts->resp->status == 0x197,pdVar8->value);
          if (CVar3 != CURLE_OK) goto LAB_00582eae;
          pcVar12 = (data->req).newurl;
          if (pcVar12 != (char *)0x0) {
            (*Curl_cfree)(pcVar12);
            (data->req).newurl = (char *)0x0;
            CVar3 = CURLE_OK;
            new_state = H2_TUNNEL_INIT;
            goto LAB_00582e08;
          }
        }
      }
      else if (iVar4 == 0x197) {
        pcVar12 = "Proxy-Authenticate";
        goto LAB_00582d68;
      }
      CVar3 = CURLE_RECV_ERROR;
      goto LAB_00582eae;
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"CONNECT tunnel established, response %d");
    }
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_ESTABLISHED,data);
    CVar3 = CURLE_OK;
  }
  else {
    new_state = H2_TUNNEL_FAILED;
LAB_00582e08:
    h2_tunnel_go_state(cf,ts,new_state,data);
  }
  uVar5 = 0;
  if ((int)plVar11[0x26] != 0) goto switchD_00582af8_default;
  goto LAB_00582adf;
switchD_00582af8_default:
  if (CVar3 == CURLE_OK) {
LAB_00582e7c:
    CVar3 = CURLE_OK;
    if ((*(byte *)((long)local_78 + 0x134) & 2) != 0) goto LAB_00582eae;
  }
  else {
LAB_00582eae:
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_FAILED,data);
    if (CVar3 != CURLE_OK) {
LAB_00582ec4:
      _Var14 = false;
      done = local_88;
      goto LAB_00582ee0;
    }
  }
switchD_00582af8_caseD_3:
  _Var14 = (int)plVar11[0x26] == 3;
  CVar3 = CURLE_OK;
  done = local_88;
LAB_00582ee0:
  *done = _Var14;
  cf->field_0x24 = cf->field_0x24 & 0xfe | _Var14;
  *(long *)((long)cf->ctx + 8) = local_98;
  return CVar3;
}

Assistant:

static CURLcode cf_h2_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct cf_call_data save;
  timediff_t check;
  struct tunnel_stream *ts = &ctx->tunnel;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* Connect the lower filters first */
  if(!cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  *done = FALSE;

  CF_DATA_SAVE(save, cf, data);
  if(!ctx->h2) {
    result = cf_h2_proxy_ctx_init(cf, data);
    if(result)
      goto out;
  }
  DEBUGASSERT(ts->authority);

  check = Curl_timeleft(data, NULL, TRUE);
  if(check <= 0) {
    failf(data, "Proxy CONNECT aborted due to timeout");
    result = CURLE_OPERATION_TIMEDOUT;
    goto out;
  }

  /* for the secondary socket (FTP), use the "connect to host"
   * but ignore the "connect to port" (use the secondary port)
   */
  result = H2_CONNECT(cf, data, ts);

out:
  *done = (result == CURLE_OK) && (ts->state == H2_TUNNEL_ESTABLISHED);
  cf->connected = *done;
  CF_DATA_RESTORE(cf, save);
  return result;
}